

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O2

void Prs_CreateVerilogPio(Cba_Ntk_t *p,Prs_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  int i;
  int f;
  int in_EDX;
  int Fill;
  int Fill_00;
  int Fill_01;
  int iVar3;
  
  Vec_IntFill(&p->vObjFunc,(p->vObjType).nCap,in_EDX);
  Vec_IntFill(&p->vObjName,(p->vObjType).nCap,Fill);
  Vec_IntFill(&p->vFonName,(p->vFonObj).nCap,Fill_00);
  Vec_IntFill(&p->vFonRange,(p->vFonObj).nCap,Fill_01);
  Cba_NtkCleanMap(p);
  if ((pNtk->vInouts).nSize == 0) {
    for (iVar3 = 0; iVar3 < (pNtk->vInputs).nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(&pNtk->vInputs,iVar3);
      iVar2 = Vec_IntEntry(&pNtk->vInputsR,iVar3);
      i = Cba_ObjAlloc(p,CBA_OBJ_PI,0,1);
      Cba_ObjSetName(p,i,iVar1);
      f = Cba_ObjFon0(p,i);
      Cba_FonSetRangeSign(p,f,iVar2);
      Cba_FonSetName(p,f,iVar1);
      Cba_NtkSetMap(p,iVar1,i);
    }
    for (iVar3 = 0; iVar3 < (pNtk->vOutputs).nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(&pNtk->vOutputs,iVar3);
      Vec_IntEntry(&pNtk->vOutputsR,iVar3);
      iVar2 = Cba_ObjAlloc(p,CBA_OBJ_PO,1,0);
      Cba_ObjSetName(p,iVar2,iVar1);
      Cba_NtkSetMap(p,iVar1,iVar2);
    }
    for (iVar3 = 0; iVar3 < (pNtk->vOrder).nSize; iVar3 = iVar3 + 1) {
      iVar1 = Vec_IntEntry(&pNtk->vOrder,iVar3);
      iVar1 = Abc_Lit2Var2(iVar1);
      iVar1 = Prs_CreateVerilogFindFon(p,iVar1);
      if (iVar1 != 0) {
        Vec_IntPush(&p->vOrder,iVar1);
      }
    }
    return;
  }
  __assert_fail("Vec_IntSize(&pNtk->vInouts) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                ,0x6fd,"void Prs_CreateVerilogPio(Cba_Ntk_t *, Prs_Ntk_t *)");
}

Assistant:

void Prs_CreateVerilogPio( Cba_Ntk_t * p, Prs_Ntk_t * pNtk )
{
    int i, NameId, RangeId, iObj, iFon;
    Cba_NtkCleanObjFuncs( p );
    Cba_NtkCleanObjNames( p );
    Cba_NtkCleanFonNames( p );
    Cba_NtkCleanFonRanges( p );
    // create inputs
    Cba_NtkCleanMap( p );
    assert( Vec_IntSize(&pNtk->vInouts) == 0 );
    Vec_IntForEachEntryTwo( &pNtk->vInputs, &pNtk->vInputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PI, 0, 1 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        iFon = Cba_ObjFon0(p, iObj);
        Cba_FonSetRangeSign( p, iFon, RangeId );
        Cba_FonSetName( p, iFon, NameId );
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create outputs
    Vec_IntForEachEntryTwo( &pNtk->vOutputs, &pNtk->vOutputsR, NameId, RangeId, i )
    {
        iObj = Cba_ObjAlloc( p, CBA_OBJ_PO, 1, 0 );
        Cba_ObjSetName( p, iObj, NameId ); // direct name
        Cba_NtkSetMap( p, NameId, iObj );
    }
    // create order
    Vec_IntForEachEntry( &pNtk->vOrder, NameId, i )
    {
        iObj = Prs_CreateVerilogFindFon( p, Abc_Lit2Var2(NameId) ); // labeled name
        if ( iObj )
            Vec_IntPush( &p->vOrder, iObj );
    }
}